

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_dispatch.cpp
# Opt level: O1

void __thiscall FConsoleCommand::FConsoleCommand(FConsoleCommand *this,char *name,CCmdRun runFunc)

{
  bool bVar1;
  char *pcVar2;
  long lVar3;
  char tname [16];
  char local_48;
  char local_47 [23];
  
  this->_vptr_FConsoleCommand = (_func_int **)&PTR__FConsoleCommand_00845618;
  this->m_RunFunc = runFunc;
  if (FConsoleCommand(char_const*,void(*)(FCommandLine&,APlayerPawn*,int))::firstTime == '\0') {
    FConsoleCommand(char_const*,void(*)(FCommandLine&,APlayerPawn*,int))::firstTime = '\x01';
    lVar3 = 0xc;
    do {
      strcpy(local_47,ActionMaps[0].Name + lVar3 + -0xc);
      local_48 = '+';
      C_AddTabCommand(&local_48);
      local_48 = '-';
      C_AddTabCommand(&local_48);
      lVar3 = lVar3 + 0x18;
    } while (lVar3 != 0x30c);
  }
  pcVar2 = copystring(name);
  this->m_Name = pcVar2;
  bVar1 = AddToHash(this,Commands);
  if (bVar1) {
    C_AddTabCommand(name);
  }
  else {
    Printf("FConsoleCommand c\'tor: %s exists\n",name);
  }
  return;
}

Assistant:

FConsoleCommand::FConsoleCommand (const char *name, CCmdRun runFunc)
	: m_RunFunc (runFunc)
{
	static bool firstTime = true;

	if (firstTime)
	{
		char tname[16];
		unsigned int i;

		firstTime = false;

		// Add all the action commands for tab completion
		for (i = 0; i < NUM_ACTIONS; i++)
		{
			strcpy (&tname[1], ActionMaps[i].Name);
			tname[0] = '+';
			C_AddTabCommand (tname);
			tname[0] = '-';
			C_AddTabCommand (tname);
		}
	}

	int ag = strcmp (name, "kill");
	if (ag == 0)
		ag=0;
	m_Name = copystring (name);

	if (!AddToHash (Commands))
		Printf ("FConsoleCommand c'tor: %s exists\n", name);
	else
		C_AddTabCommand (name);
}